

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::analyze_meshlet_writes
          (CompilerHLSL *this,uint32_t func_id,uint32_t id_per_vertex,uint32_t id_per_primitive,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  size_t *psVar1;
  StorageClass SVar2;
  _Hash_node_base *p_Var3;
  size_t sVar4;
  Variant *pVVar5;
  Parameter *pPVar6;
  Parameter *pPVar7;
  ID IVar8;
  bool bVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  SPIRFunction *pSVar12;
  SPIRBlock *pSVar13;
  uint32_t *puVar14;
  ulong uVar15;
  SPIRVariable *var;
  SPIRFunction *pSVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  __node_base_ptr p_Var20;
  __node_base_ptr p_Var21;
  uint32_t uVar22;
  Parameter *iarg;
  Parameter *pPVar23;
  Instruction *instr;
  bool bVar24;
  __hashtable *__h;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range5;
  TypedID<(spirv_cross::Types)6> *block;
  __node_gen_type __node_gen;
  uint local_6c;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_68;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *local_60;
  TypedID<(spirv_cross::Types)6> *local_58;
  TypedID<(spirv_cross::Types)6> *local_50;
  CompilerHLSL *local_48;
  Instruction *local_40;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  uVar15 = (processed_func_ids->_M_h)._M_bucket_count;
  uVar18 = (ulong)func_id % uVar15;
  p_Var20 = (processed_func_ids->_M_h)._M_buckets[uVar18];
  p_Var21 = (__node_base_ptr)0x0;
  if ((p_Var20 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var20->_M_nxt, p_Var21 = p_Var20,
     *(uint32_t *)&p_Var20->_M_nxt[1]._M_nxt != func_id)) {
    while (p_Var20 = p_Var3, p_Var3 = p_Var20->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var21 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar15 != uVar18) ||
         (p_Var21 = p_Var20, *(uint *)&p_Var3[1]._M_nxt == func_id)) goto LAB_001d862d;
    }
    p_Var21 = (__node_base_ptr)0x0;
  }
LAB_001d862d:
  if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (_Hash_node_base *)0x0)) {
    local_6c = func_id;
    local_68 = processed_func_ids;
    local_38 = processed_func_ids;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)processed_func_ids,&local_6c);
    pSVar12 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + local_6c);
    sVar4 = (pSVar12->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
            buffer_size;
    if (sVar4 != 0) {
      local_50 = (pSVar12->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
                 ptr;
      local_58 = local_50 + sVar4;
      local_60 = &pSVar12->arguments;
      local_48 = this;
      do {
        pSVar13 = Variant::get<spirv_cross::SPIRBlock>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + local_50->id);
        sVar4 = (pSVar13->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
        if (sVar4 != 0) {
          instr = (pSVar13->ops).super_VectorView<spirv_cross::Instruction>.ptr;
          local_40 = instr + sVar4;
          do {
            puVar14 = Compiler::stream((Compiler *)this,instr);
            uVar17 = instr->op - 0x39;
            if (uVar17 < 0xe) {
              if ((0x2f30U >> (uVar17 & 0x1f) & 1) == 0) {
                if (uVar17 == 0) {
                  uVar17 = puVar14[2];
                  analyze_meshlet_writes(this,uVar17,id_per_vertex,id_per_primitive,local_68);
                  pSVar16 = Variant::get<spirv_cross::SPIRFunction>
                                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr + uVar17);
                  sVar4 = (pSVar16->arguments).
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                  if (sVar4 != 0) {
                    pPVar23 = (pSVar16->arguments).
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                    pPVar6 = pPVar23 + sVar4;
                    do {
                      if (pPVar23->alias_global_variable == true) {
                        sVar4 = (pSVar12->arguments).
                                super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                        if (sVar4 != 0) {
                          lVar19 = 0;
                          do {
                            bVar9 = false;
                            if (*(uint32_t *)
                                 ((long)&(((pSVar12->arguments).
                                           super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                          ptr)->id).id + lVar19) == (pPVar23->id).id) {
                              bVar9 = true;
                              break;
                            }
                            bVar24 = sVar4 * 0x14 + -0x14 != lVar19;
                            lVar19 = lVar19 + 0x14;
                          } while (bVar24);
                          if (bVar9) goto LAB_001d8932;
                        }
                        uVar11 = Compiler::expression_type_id((Compiler *)this,(pPVar23->id).id);
                        IVar8.id = (pPVar23->id).id;
                        uVar10 = pPVar23->read_count;
                        uVar22 = pPVar23->write_count;
                        SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                                  (local_60,(pSVar12->arguments).
                                            super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                            buffer_size + 1);
                        pPVar7 = (pSVar12->arguments).
                                 super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                        sVar4 = (pSVar12->arguments).
                                super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                        pPVar7[sVar4].type.id = uVar11;
                        pPVar7[sVar4].id = (ID)IVar8.id;
                        pPVar7[sVar4].read_count = uVar10;
                        pPVar7[sVar4].write_count = uVar22;
                        pPVar7[sVar4].alias_global_variable = true;
                        psVar1 = &(pSVar12->arguments).
                                  super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
                        ;
                        *psVar1 = *psVar1 + 1;
                        this = local_48;
                      }
LAB_001d8932:
                      pPVar23 = pPVar23 + 1;
                    } while (pPVar23 != pPVar6);
                  }
                }
              }
              else {
                uVar15 = (ulong)puVar14[(ulong)(instr->op != 0x3e) * 2];
                if ((uVar15 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.buffer_size) &&
                   (pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr,
                   pVVar5[uVar15].type == TypeVariable)) {
                  var = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar15);
                }
                else {
                  var = (SPIRVariable *)0x0;
                }
                if ((var != (SPIRVariable *)0x0) &&
                   ((var->storage == StorageClassTaskPayloadWorkgroupEXT || (var->storage == Output)
                    ))) {
                  uVar10 = Compiler::get_decoration
                                     ((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
                  uVar22 = (var->super_IVariant).self.id;
                  if ((uVar10 - 0x14b1 < 0xfffffffd) &&
                     ((var->storage != StorageClassTaskPayloadWorkgroupEXT &&
                      (bVar9 = CompilerGLSL::is_per_primitive_variable
                                         (&this->super_CompilerGLSL,var), uVar22 = id_per_vertex,
                      bVar9)))) {
                    uVar22 = id_per_primitive;
                  }
                  sVar4 = (pSVar12->arguments).
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                  if (sVar4 != 0) {
                    lVar19 = 0;
                    do {
                      bVar9 = false;
                      if (*(uint32_t *)
                           ((long)&(((pSVar12->arguments).
                                     super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr)->id
                                   ).id + lVar19) == uVar22) {
                        bVar9 = true;
                        break;
                      }
                      bVar24 = sVar4 * 0x14 + -0x14 != lVar19;
                      lVar19 = lVar19 + 0x14;
                    } while (bVar24);
                    if (bVar9) goto LAB_001d893f;
                  }
                  uVar10 = Compiler::expression_type_id((Compiler *)this,uVar22);
                  SVar2 = var->storage;
                  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                            (local_60,(pSVar12->arguments).
                                      super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                      buffer_size + 1);
                  pPVar6 = (pSVar12->arguments).
                           super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                  sVar4 = (pSVar12->arguments).
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                  pPVar6[sVar4].type.id = uVar10;
                  pPVar6[sVar4].id.id = uVar22;
                  pPVar6[sVar4].read_count = 1;
                  pPVar6[sVar4].write_count = (uint)(SVar2 != StorageClassTaskPayloadWorkgroupEXT);
                  pPVar6[sVar4].alias_global_variable = true;
                  psVar1 = &(pSVar12->arguments).
                            super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                  *psVar1 = *psVar1 + 1;
                }
              }
            }
LAB_001d893f:
            instr = instr + 1;
          } while (instr != local_40);
        }
        local_50 = local_50 + 1;
      } while (local_50 != local_58);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::analyze_meshlet_writes(uint32_t func_id, uint32_t id_per_vertex, uint32_t id_per_primitive,
                                          std::unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
		return;
	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);
	// Recursively establish global args added to functions on which we depend.
	for (auto& block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpFunctionCall:
			{
				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				analyze_meshlet_writes(inner_func_id, id_per_vertex, id_per_primitive, processed_func_ids);
				auto &inner_func = get<SPIRFunction>(inner_func_id);
				for (auto &iarg : inner_func.arguments)
				{
					if (!iarg.alias_global_variable)
						continue;

					bool already_declared = false;
					for (auto &arg : func.arguments)
					{
						if (arg.id == iarg.id)
						{
							already_declared = true;
							break;
						}
					}

					if (!already_declared)
					{
						// basetype is effectively ignored here since we declare the argument
						// with explicit types. Just pass down a valid type.
						func.arguments.push_back({ expression_type_id(iarg.id), iarg.id,
						                           iarg.read_count, iarg.write_count, true });
					}
				}
				break;
			}

			case OpStore:
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpInBoundsPtrAccessChain:
			case OpArrayLength:
			{
				auto *var = maybe_get<SPIRVariable>(ops[op == OpStore ? 0 : 2]);
				if (var && (var->storage == StorageClassOutput || var->storage == StorageClassTaskPayloadWorkgroupEXT))
				{
					bool already_declared = false;
					auto builtin_type = BuiltIn(get_decoration(var->self, DecorationBuiltIn));

					uint32_t var_id = var->self;
					if (var->storage != StorageClassTaskPayloadWorkgroupEXT &&
						builtin_type != BuiltInPrimitivePointIndicesEXT &&
						builtin_type != BuiltInPrimitiveLineIndicesEXT &&
						builtin_type != BuiltInPrimitiveTriangleIndicesEXT)
					{
						var_id = is_per_primitive_variable(*var) ? id_per_primitive : id_per_vertex;
					}

					for (auto &arg : func.arguments)
					{
						if (arg.id == var_id)
						{
							already_declared = true;
							break;
						}
					}

					if (!already_declared)
					{
						// basetype is effectively ignored here since we declare the argument
						// with explicit types. Just pass down a valid type.
						uint32_t type_id = expression_type_id(var_id);
						if (var->storage == StorageClassTaskPayloadWorkgroupEXT)
							func.arguments.push_back({ type_id, var_id, 1u, 0u, true });
						else
							func.arguments.push_back({ type_id, var_id, 1u, 1u, true });
					}
				}
				break;
			}

			default:
				break;
			}
		}
	}
}